

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

bool CompileTypemask(SQIntVec *res,SQChar *typemask)

{
  longlong *plVar1;
  char cVar2;
  ulong uVar3;
  SQUnsignedInteger SVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  cVar2 = *typemask;
  bVar7 = cVar2 == '\0';
  if (!bVar7) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      lVar6 = lVar6 + 2;
      while (cVar2 == ' ') {
        cVar2 = typemask[lVar6 + -1];
        lVar6 = lVar6 + 1;
        bVar7 = cVar2 == '\0';
        if (bVar7) goto switchD_0011cadd_caseD_64;
      }
      switch(cVar2) {
      case 'a':
        uVar3 = 0x40;
        break;
      case 'b':
        uVar3 = 8;
        break;
      case 'c':
        uVar3 = 0x300;
        break;
      case 'd':
      case 'e':
      case 'h':
      case 'j':
      case 'k':
      case 'l':
      case 'm':
      case 'q':
      case 'w':
        goto switchD_0011cadd_caseD_64;
      case 'f':
        uVar3 = 4;
        break;
      case 'g':
        uVar3 = 0x400;
        break;
      case 'i':
        uVar3 = 2;
        break;
      case 'n':
        uVar3 = 6;
        break;
      case 'o':
        uVar3 = 1;
        break;
      case 'p':
        uVar3 = 0x800;
        break;
      case 'r':
        uVar3 = 0x10000;
        break;
      case 's':
        uVar3 = 0x10;
        break;
      case 't':
        uVar3 = 0x20;
        break;
      case 'u':
        uVar3 = 0x80;
        break;
      case 'v':
        uVar3 = 0x1000;
        break;
      case 'x':
        uVar3 = 0x8000;
        break;
      case 'y':
        uVar3 = 0x4000;
        break;
      default:
        if (cVar2 == '.') {
          if (res->_allocated <= res->_size) {
            SVar4 = res->_size * 2;
            if (SVar4 == 0) {
              SVar4 = 4;
            }
            plVar1 = (longlong *)sq_vm_realloc(res->_vals,res->_allocated << 3,SVar4 * 8);
            res->_vals = plVar1;
            res->_allocated = SVar4;
          }
          SVar4 = res->_size;
          res->_size = SVar4 + 1;
          res->_vals[SVar4] = -1;
          goto LAB_0011cc0a;
        }
        goto switchD_0011cadd_caseD_64;
      }
      uVar5 = uVar5 | uVar3;
      if (typemask[lVar6 + -1] == '|') {
        if (typemask[lVar6] == '\0') break;
      }
      else {
        if (res->_allocated <= res->_size) {
          SVar4 = res->_size * 2;
          if (SVar4 == 0) {
            SVar4 = 4;
          }
          plVar1 = (longlong *)sq_vm_realloc(res->_vals,res->_allocated << 3,SVar4 * 8);
          res->_vals = plVar1;
          res->_allocated = SVar4;
        }
        SVar4 = res->_size;
        res->_size = SVar4 + 1;
        res->_vals[SVar4] = uVar5;
LAB_0011cc0a:
        lVar6 = lVar6 + -1;
        uVar5 = 0;
      }
      cVar2 = typemask[lVar6];
      bVar7 = cVar2 == '\0';
    } while (!bVar7);
switchD_0011cadd_caseD_64:
  }
  return bVar7;
}

Assistant:

bool CompileTypemask(SQIntVec &res,const SQChar *typemask)
{
    SQInteger i = 0;
    SQInteger mask = 0;
    while(typemask[i] != 0) {
        switch(typemask[i]) {
            case 'o': mask |= _RT_NULL; break;
            case 'i': mask |= _RT_INTEGER; break;
            case 'f': mask |= _RT_FLOAT; break;
            case 'n': mask |= (_RT_FLOAT | _RT_INTEGER); break;
            case 's': mask |= _RT_STRING; break;
            case 't': mask |= _RT_TABLE; break;
            case 'a': mask |= _RT_ARRAY; break;
            case 'u': mask |= _RT_USERDATA; break;
            case 'c': mask |= (_RT_CLOSURE | _RT_NATIVECLOSURE); break;
            case 'b': mask |= _RT_BOOL; break;
            case 'g': mask |= _RT_GENERATOR; break;
            case 'p': mask |= _RT_USERPOINTER; break;
            case 'v': mask |= _RT_THREAD; break;
            case 'x': mask |= _RT_INSTANCE; break;
            case 'y': mask |= _RT_CLASS; break;
            case 'r': mask |= _RT_WEAKREF; break;
            case '.': mask = -1; res.push_back(mask); i++; mask = 0; continue;
            case ' ': i++; continue; //ignores spaces
            default:
                return false;
        }
        i++;
        if(typemask[i] == '|') {
            i++;
            if(typemask[i] == 0)
                return false;
            continue;
        }
        res.push_back(mask);
        mask = 0;

    }
    return true;
}